

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfontdialog.cpp
# Opt level: O3

void __thiscall QFontDialogPrivate::initHelper(QFontDialogPrivate *this,QPlatformDialogHelper *h)

{
  void **ppvVar1;
  undefined4 *puVar2;
  long in_FS_OFFSET;
  Connection local_68;
  code *local_60;
  ImplFn local_58;
  QObject local_50 [8];
  code *local_48;
  undefined8 local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  ppvVar1 = *(void ***)&(this->super_QDialogPrivate).super_QWidgetPrivate.field_0x8;
  QPlatformFontDialogHelper::setOptions((QSharedPointer *)h);
  QFontDialog::currentFont((QFontDialog *)&local_48);
  (**(code **)(*(long *)h + 0x80))(h,(QFont *)&local_48);
  QFont::~QFont((QFont *)&local_48);
  local_60 = QFontDialog::currentFontChanged;
  local_58 = (ImplFn)0x0;
  local_48 = QPlatformFontDialogHelper::currentFontChanged;
  local_40 = 0;
  puVar2 = (undefined4 *)operator_new(0x20);
  *puVar2 = 1;
  *(code **)(puVar2 + 2) =
       QtPrivate::
       QCallableObject<void_(QFontDialog::*)(const_QFont_&),_QtPrivate::List<const_QFont_&>,_void>::
       impl;
  *(code **)(puVar2 + 4) = QFontDialog::currentFontChanged;
  *(undefined8 *)(puVar2 + 6) = 0;
  QObject::connectImpl
            (local_50,(void **)h,(QObject *)&local_48,ppvVar1,(QSlotObjectBase *)&local_60,
             (ConnectionType)puVar2,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_50);
  local_60 = QFontDialog::fontSelected;
  local_58 = (ImplFn)0x0;
  local_48 = QPlatformFontDialogHelper::fontSelected;
  local_40 = 0;
  puVar2 = (undefined4 *)operator_new(0x20);
  *puVar2 = 1;
  *(code **)(puVar2 + 2) =
       QtPrivate::
       QCallableObject<void_(QFontDialog::*)(const_QFont_&),_QtPrivate::List<const_QFont_&>,_void>::
       impl;
  *(code **)(puVar2 + 4) = QFontDialog::fontSelected;
  *(undefined8 *)(puVar2 + 6) = 0;
  QObject::connectImpl
            ((QObject *)&local_68,(void **)h,(QObject *)&local_48,ppvVar1,
             (QSlotObjectBase *)&local_60,(ConnectionType)puVar2,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection(&local_68);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QFontDialogPrivate::initHelper(QPlatformDialogHelper *h)
{
    Q_Q(QFontDialog);
    auto *fontDialogHelper = static_cast<QPlatformFontDialogHelper *>(h);
    fontDialogHelper->setOptions(options);
    fontDialogHelper->setCurrentFont(q->currentFont());
    QObject::connect(fontDialogHelper, &QPlatformFontDialogHelper::currentFontChanged,
                     q, &QFontDialog::currentFontChanged);
    QObject::connect(fontDialogHelper, &QPlatformFontDialogHelper::fontSelected,
                     q, &QFontDialog::fontSelected);
}